

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void aom_highbd_comp_avg_upsampled_pred_c
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               uint8_t *pred8,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,
               int ref_stride,int bd,int subpel_search)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  aom_highbd_upsampled_pred_sse2
            (xd,cm,mi_row,mi_col,mv,comp_pred8,width,height,subpel_x_q3,subpel_y_q3,ref8,ref_stride,
             bd,subpel_search);
  if (0 < height) {
    lVar2 = (long)comp_pred8 * 2;
    lVar1 = (long)pred8 * 2;
    iVar3 = 0;
    do {
      if (0 < width) {
        uVar4 = 0;
        do {
          *(short *)(lVar2 + uVar4 * 2) =
               (short)((uint)*(ushort *)(lVar1 + uVar4 * 2) + (uint)*(ushort *)(lVar2 + uVar4 * 2) +
                       1 >> 1);
          uVar4 = uVar4 + 1;
        } while ((uint)width != uVar4);
      }
      iVar3 = iVar3 + 1;
      lVar2 = lVar2 + (long)width * 2;
      lVar1 = lVar1 + (long)width * 2;
    } while (iVar3 != height);
  }
  return;
}

Assistant:

void aom_highbd_comp_avg_upsampled_pred_c(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred8, const uint8_t *pred8, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref8,
    int ref_stride, int bd, int subpel_search) {
  int i, j;

  const uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred8, width,
                            height, subpel_x_q3, subpel_y_q3, ref8, ref_stride,
                            bd, subpel_search);
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      comp_pred[j] = ROUND_POWER_OF_TWO(pred[j] + comp_pred[j], 1);
    }
    comp_pred += width;
    pred += width;
  }
}